

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall llvm::APFloat::Storage::Storage(Storage *this,IEEEFloat *F,fltSemantics *Semantics)

{
  fltSemantics *Semantics_00;
  APFloat AStack_88;
  undefined1 local_68 [32];
  IEEEFloat local_48;
  
  if (Semantics != (fltSemantics *)semPPCDoubleDouble) {
    detail::IEEEFloat::IEEEFloat((IEEEFloat *)this,F);
    return;
  }
  Semantics_00 = F->semantics;
  detail::IEEEFloat::IEEEFloat(&local_48,F);
  detail::IEEEFloat::IEEEFloat((IEEEFloat *)&AStack_88,&local_48);
  Storage((Storage *)(local_68 + 8),(IEEEFloat *)&AStack_88,Semantics_00);
  detail::IEEEFloat::~IEEEFloat((IEEEFloat *)&AStack_88);
  detail::IEEEFloat::IEEEFloat(&AStack_88.U.IEEE,(fltSemantics *)semIEEEdouble);
  detail::DoubleAPFloat::DoubleAPFloat
            ((DoubleAPFloat *)this,(fltSemantics *)semPPCDoubleDouble,(APFloat *)local_68,&AStack_88
            );
  ~Storage((Storage *)&AStack_88.U.IEEE);
  ~Storage((Storage *)(local_68 + 8));
  detail::IEEEFloat::~IEEEFloat(&local_48);
  return;
}

Assistant:

APFloat::Storage::Storage(IEEEFloat F, const fltSemantics &Semantics) {
  if (usesLayout<IEEEFloat>(Semantics)) {
    new (&IEEE) IEEEFloat(std::move(F));
    return;
  }
  if (usesLayout<DoubleAPFloat>(Semantics)) {
    const auto& semantics = F.getSemantics();
    new (&Double)
        DoubleAPFloat(Semantics, APFloat(std::move(F), semantics),
                      APFloat(semIEEEdouble));
    return;
  }
  llvm_unreachable("Unexpected semantics");
}